

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * IR::Instr::NewConstantLoad
                  (RegOpnd *dstOpnd,intptr_t varConst,ValueType type,Func *func,Var varLocal)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  IntConstOpnd *src1Opnd;
  ThreadContextInfo *pTVar4;
  intptr_t iVar5;
  AddrOpnd *pAVar6;
  undefined4 *puVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  long lStack_48;
  ValueType valueType;
  IntConstType value;
  Instr *instr;
  Opnd *srcOpnd;
  Var varLocal_local;
  Func *func_local;
  intptr_t varConst_local;
  RegOpnd *dstOpnd_local;
  ValueType type_local;
  
  dstOpnd_local._6_2_ = type.field_0;
  bVar2 = Js::TaggedInt::Is(varConst);
  if (bVar2) {
    iVar3 = Js::TaggedInt::ToInt32((Var)varConst);
    lStack_48 = (long)iVar3;
    src1Opnd = IntConstOpnd::New(lStack_48,TyInt32,func,false);
    value = (IntConstType)New(LdC_A_I4,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,func);
    bVar2 = StackSym::IsSingleDef(dstOpnd->m_sym);
    if (bVar2) {
      StackSym::SetIsIntConst(dstOpnd->m_sym,lStack_48);
    }
  }
  else {
    pTVar4 = Func::GetThreadContextInfo(func);
    iVar5 = ThreadContextInfo::GetNullFrameDisplayAddr(pTVar4);
    if (varConst == iVar5) {
      pTVar4 = Func::GetThreadContextInfo(func);
      iVar5 = ThreadContextInfo::GetNullFrameDisplayAddr(pTVar4);
      pAVar6 = AddrOpnd::New(iVar5,AddrOpndKindDynamicMisc,func,false,(Var)0x0);
      value = (IntConstType)New(Ld_A,&dstOpnd->super_Opnd,&pAVar6->super_Opnd,func);
    }
    else {
      pTVar4 = Func::GetThreadContextInfo(func);
      iVar5 = ThreadContextInfo::GetStrictNullFrameDisplayAddr(pTVar4);
      if (varConst == iVar5) {
        pTVar4 = Func::GetThreadContextInfo(func);
        iVar5 = ThreadContextInfo::GetStrictNullFrameDisplayAddr(pTVar4);
        pAVar6 = AddrOpnd::New(iVar5,AddrOpndKindDynamicMisc,func,false,(Var)0x0);
        value = (IntConstType)New(Ld_A,&dstOpnd->super_Opnd,&pAVar6->super_Opnd,func);
      }
      else {
        ValueType::ValueType((ValueType *)&local_4a.field_0);
        bVar2 = ValueType::IsString((ValueType *)((long)&dstOpnd_local + 6));
        if (bVar2) {
          pAVar6 = AddrOpnd::New(varConst,AddrOpndKindDynamicVar,func,true,varLocal);
          value = (IntConstType)New(LdStr,&dstOpnd->super_Opnd,&pAVar6->super_Opnd,func);
          if ((*(uint *)&dstOpnd->m_sym->field_0x18 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                               ,0xec0,"(dstOpnd->m_sym->m_isSingleDef)",
                               "dstOpnd->m_sym->m_isSingleDef");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          bVar2 = StackSym::IsSingleDef(dstOpnd->m_sym);
          if (bVar2) {
            StackSym::SetIsStrConst(dstOpnd->m_sym);
          }
          Opnd::SetValueType(&dstOpnd->super_Opnd,ValueType::String);
          Opnd::SetValueType(&pAVar6->super_Opnd,ValueType::String);
        }
        else {
          bVar2 = ValueType::IsNumber((ValueType *)((long)&dstOpnd_local + 6));
          if (bVar2) {
            bVar2 = Func::IsOOPJIT(func);
            if (bVar2) {
              instr = (Instr *)FloatConstOpnd::New((Var)varConst,TyFloat64,func,(Var)0x0);
            }
            else {
              instr = (Instr *)FloatConstOpnd::New((Var)varConst,TyFloat64,func,(Var)0x0);
            }
            value = (IntConstType)New(LdC_A_R8,&dstOpnd->super_Opnd,(Opnd *)instr,func);
            bVar2 = StackSym::IsSingleDef(dstOpnd->m_sym);
            if (bVar2) {
              StackSym::SetIsFloatConst(dstOpnd->m_sym);
              *(uint *)&dstOpnd->m_sym->field_0x18 =
                   *(uint *)&dstOpnd->m_sym->field_0x18 & 0xfffffffd;
            }
          }
          else {
            bVar2 = ValueType::IsUndefined((ValueType *)((long)&dstOpnd_local + 6));
            if (((bVar2) ||
                (bVar2 = ValueType::IsNull((ValueType *)((long)&dstOpnd_local + 6)), bVar2)) ||
               (bVar2 = ValueType::IsBoolean((ValueType *)((long)&dstOpnd_local + 6)), bVar2)) {
              local_4a = dstOpnd_local._6_2_;
            }
            else {
              local_4a.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::GetObject(Object);
            }
            pAVar6 = AddrOpnd::New(varConst,AddrOpndKindDynamicVar,func,true,varLocal);
            value = (IntConstType)New(Ld_A,&dstOpnd->super_Opnd,&pAVar6->super_Opnd,func);
            bVar2 = StackSym::IsSingleDef(dstOpnd->m_sym);
            if (bVar2) {
              *(uint *)&dstOpnd->m_sym->field_0x18 =
                   *(uint *)&dstOpnd->m_sym->field_0x18 & 0xfffffff7 | 8;
            }
            Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)local_4a.field_0);
            Opnd::SetValueType(&pAVar6->super_Opnd,(ValueType)local_4a.field_0);
          }
        }
      }
    }
  }
  return (Instr *)value;
}

Assistant:

IR::Instr* IR::Instr::NewConstantLoad(IR::RegOpnd* dstOpnd, intptr_t varConst, ValueType type, Func* func, Js::Var varLocal/* = nullptr*/)
{
    IR::Opnd *srcOpnd = nullptr;
    IR::Instr *instr;

    if (Js::TaggedInt::Is(varConst))
    {
        IntConstType value = Js::TaggedInt::ToInt32((Js::Var)varConst);
        instr = IR::Instr::New(Js::OpCode::LdC_A_I4, dstOpnd, IR::IntConstOpnd::New(value, TyInt32, func), func);
        if (dstOpnd->m_sym->IsSingleDef())
        {
            dstOpnd->m_sym->SetIsIntConst(value);
        }
    }
    else
    {
        if (varConst == func->GetThreadContextInfo()->GetNullFrameDisplayAddr())
        {
            instr = IR::Instr::New(
                Js::OpCode::Ld_A,
                dstOpnd,
                IR::AddrOpnd::New(
                    func->GetThreadContextInfo()->GetNullFrameDisplayAddr(),
                    IR::AddrOpndKindDynamicMisc,
                    func),
                func);
        }
        else if (varConst == func->GetThreadContextInfo()->GetStrictNullFrameDisplayAddr())
        {
            instr = IR::Instr::New(
                Js::OpCode::Ld_A,
                dstOpnd,
                IR::AddrOpnd::New(
                    func->GetThreadContextInfo()->GetStrictNullFrameDisplayAddr(),
                    IR::AddrOpndKindDynamicMisc,
                    func),
                func);
        }
        else
        {

            ValueType valueType;
            if(type.IsString())
            {
                srcOpnd = IR::AddrOpnd::New(varConst, IR::AddrOpndKindDynamicVar, func, true, varLocal);
                instr = IR::Instr::New(Js::OpCode::LdStr, dstOpnd, srcOpnd, func);
                Assert(dstOpnd->m_sym->m_isSingleDef);
                if (dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->SetIsStrConst();
                }
                dstOpnd->SetValueType(ValueType::String);
                srcOpnd->SetValueType(ValueType::String);
            }
            else if(type.IsNumber())
            {
                // TODO (michhol): OOP JIT. we may need to unbox before sending over const table

                if (!func->IsOOPJIT())
                {
                    srcOpnd = IR::FloatConstOpnd::New((Js::Var)varConst, TyFloat64, func);
                }
                else
                {
                    srcOpnd = IR::FloatConstOpnd::New((Js::Var)varConst, TyFloat64, func
#if !FLOATVAR
                        ,varLocal
#endif
                    );

                }

                instr = IR::Instr::New(Js::OpCode::LdC_A_R8, dstOpnd, srcOpnd, func);
                if (dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->SetIsFloatConst();

#if FLOATVAR
                    dstOpnd->m_sym->m_isNotNumber = FALSE;
#else
                    // Don't set m_isNotNumber to true if the float constant value is an int32 or uint32. Uint32s may sometimes be
                    // treated as int32s for the purposes of int specialization.
                    dstOpnd->m_sym->m_isNotNumber = !Js::JavascriptNumber::IsInt32OrUInt32(((IR::FloatConstOpnd*)srcOpnd)->m_value);


#endif
                }
            }
            else
            {
                if (type.IsUndefined() || type.IsNull() || type.IsBoolean())
                {
                    valueType = type;
                }
                else
                {
                    valueType = ValueType::GetObject(ObjectType::Object);
                }
                srcOpnd = IR::AddrOpnd::New(varConst, IR::AddrOpndKindDynamicVar, func, true, varLocal);
                instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, func);
                if (dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->m_isConst = true;
                }
                dstOpnd->SetValueType(valueType);
                srcOpnd->SetValueType(valueType);
            }
        }
    }
    return instr;
}